

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

tjscalingfactor * tjGetScalingFactors(int *numscalingfactors)

{
  char *pcVar1;
  
  if (numscalingfactors != (int *)0x0) {
    *numscalingfactors = 0x10;
    return sf;
  }
  pcVar1 = (char *)__tls_get_addr(&PTR_00199f20);
  builtin_strncpy(pcVar1,"tjGetScalingFactors(): Invalid argument",0x28);
  return (tjscalingfactor *)0x0;
}

Assistant:

DLLEXPORT tjscalingfactor *tjGetScalingFactors(int *numscalingfactors)
{
  if (numscalingfactors == NULL) {
    snprintf(errStr, JMSG_LENGTH_MAX,
             "tjGetScalingFactors(): Invalid argument");
    return NULL;
  }

  *numscalingfactors = NUMSF;
  return (tjscalingfactor *)sf;
}